

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_random.hpp
# Opt level: O2

int __thiscall iutest::detail::iuRandom::init(iuRandom *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = GetIndefiniteValue();
  iVar2 = init(this,(EVP_PKEY_CTX *)(ulong)uVar1);
  return iVar2;
}

Assistant:

void init()
    {
        init(GetIndefiniteValue());
    }